

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O3

Result __thiscall
wabt::LexerSourceLineFinder::GetLineOffsets
          (LexerSourceLineFinder *this,int find_line,OffsetRange *out_range)

{
  pointer pRVar1;
  pointer pRVar2;
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var3;
  char cVar4;
  int iVar5;
  void *__s;
  ulong uVar6;
  ulong uVar7;
  value_type_conflict4 *__val;
  ulong uVar8;
  Enum EVar9;
  OffsetRange OVar10;
  long local_40;
  Offset buffer_file_offset;
  Offset line_offset;
  undefined4 extraout_var;
  
  uVar7 = (ulong)find_line;
  if (uVar7 < (ulong)((long)(this->line_ranges_).
                            super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->line_ranges_).
                            super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    OVar10 = GetCachedLine(this,find_line);
    *out_range = OVar10;
    EVar9 = Ok;
  }
  else {
    __s = operator_new(0x10000);
    memset(__s,0,0x10000);
    pRVar1 = (this->line_ranges_).
             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->line_ranges_).
             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar1 == pRVar2) {
      __assert_fail("!line_ranges_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/lexer-source-line-finder.cc"
                    ,0x58,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
    }
    local_40 = 0;
    if ((ulong)((long)pRVar2 - (long)pRVar1 >> 4) <= uVar7) {
      do {
        EVar9 = Error;
        if (this->eof_ != false) goto LAB_00f4aabf;
        _Var3._M_head_impl =
             (this->source_)._M_t.
             super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
             super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
             super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
        iVar5 = (*(_Var3._M_head_impl)->_vptr_LexerSource[3])(_Var3._M_head_impl,&local_40);
        if (iVar5 == 1) goto LAB_00f4aabf;
        _Var3._M_head_impl =
             (this->source_)._M_t.
             super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
             super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
             super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
        iVar5 = (*(_Var3._M_head_impl)->_vptr_LexerSource[4])(_Var3._M_head_impl,__s,0x10000);
        uVar6 = CONCAT44(extraout_var,iVar5);
        if (uVar6 < 0x10000) {
          this->eof_ = true;
        }
        if (__s < (void *)((long)__s + uVar6)) {
          uVar8 = 0;
          do {
            cVar4 = *(char *)((long)__s + uVar8);
            if (cVar4 == '\n') {
              buffer_file_offset = (local_40 - (ulong)this->last_cr_) + uVar8;
              std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
              emplace_back<unsigned_long&,unsigned_long&>
                        ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                          *)&this->line_ranges_,&this->next_line_start_,&buffer_file_offset);
              this->next_line_start_ = buffer_file_offset + this->last_cr_ + 1;
              cVar4 = *(char *)((long)__s + uVar8);
            }
            this->last_cr_ = cVar4 == '\r';
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        if (this->eof_ != false) {
          buffer_file_offset = uVar6 + local_40;
          std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
          emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                      *)&this->line_ranges_,&this->next_line_start_,&buffer_file_offset);
        }
      } while ((ulong)((long)(this->line_ranges_).
                             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->line_ranges_).
                             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar7);
    }
    OVar10 = GetCachedLine(this,find_line);
    *out_range = OVar10;
    EVar9 = Ok;
LAB_00f4aabf:
    operator_delete(__s);
  }
  return (Result)EVar9;
}

Assistant:

Result LexerSourceLineFinder::GetLineOffsets(int find_line,
                                             OffsetRange* out_range) {
  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  }

  const size_t kBufferSize = 1 << 16;
  std::vector<char> buffer(kBufferSize);

  assert(!line_ranges_.empty());
  Offset buffer_file_offset = 0;
  while (!IsLineCached(find_line) && !eof_) {
    CHECK_RESULT(source_->Tell(&buffer_file_offset));
    size_t read_size = source_->Fill(buffer.data(), buffer.size());
    if (read_size < buffer.size()) {
      eof_ = true;
    }

    for (auto iter = buffer.begin(), end = iter + read_size; iter < end;
         ++iter) {
      if (*iter == '\n') {
        // Don't include \n or \r in the line range.
        Offset line_offset =
            buffer_file_offset + (iter - buffer.begin()) - last_cr_;
        line_ranges_.emplace_back(next_line_start_, line_offset);
        next_line_start_ = line_offset + last_cr_ + 1;
      }
      last_cr_ = *iter == '\r';
    }

    if (eof_) {
      // Add the final line as an empty range.
      Offset end = buffer_file_offset + read_size;
      line_ranges_.emplace_back(next_line_start_, end);
    }
  }

  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  } else {
    assert(eof_);
    return Result::Error;
  }
}